

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableButNotModel_Test::
~Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableButNotModel_Test
          (Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableButNotModel_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsWhenBaseUnitsAddedToVariableButNotModel)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");

    v1->setUnits(u1);
    c1->addVariable(v1);
    m->addComponent(c1);

    EXPECT_TRUE(m->hasUnlinkedUnits());
}